

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

void cali_find_all_in_snapshot
               (uchar *buf,cali_id_t attr_id,size_t *bytes_read,cali_entry_proc_fn proc_fn,
               void *user_arg)

{
  int iVar1;
  Node *node;
  Node *pNVar2;
  size_t n;
  size_t pos;
  size_t pos_1;
  Caliper c;
  size_t local_b0;
  size_t *local_a8;
  size_t local_a0 [2];
  Entry local_90;
  CompressedSnapshotRecordView local_78;
  Caliper local_50;
  
  local_a0[0] = 0;
  local_a8 = bytes_read;
  cali::Caliper::Caliper(&local_50);
  cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView(&local_78,buf,local_a0);
  local_b0 = 0;
  local_a0[1] = 1;
  if (local_78.m_num_imm + local_78.m_num_nodes != 0) {
    do {
      cali::CompressedSnapshotRecordView::unpack_next_entry
                (&local_90,&local_78,&local_50.super_CaliperMetadataAccessInterface,&local_b0,
                 local_a0 + 1);
      if (local_90.m_node != (Node *)0x0) {
        pNVar2 = local_90.m_node;
        if (((local_90.m_node)->m_attribute == 8) && ((local_90.m_node)->m_id == attr_id)) {
          iVar1 = (*proc_fn)(user_arg,attr_id,local_90.m_value.m_v);
          if (iVar1 == 0) break;
        }
        else {
          do {
            if (pNVar2->m_id == 0xffffffffffffffff) break;
            if ((pNVar2->m_attribute == attr_id) &&
               (iVar1 = (*proc_fn)(user_arg,attr_id,(pNVar2->m_data).m_v), iVar1 == 0))
            goto LAB_00205eab;
            pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                       super_LockfreeIntrusiveTree<cali::Node>).m_me +
                               (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
          } while (pNVar2 != (Node *)0x0);
        }
      }
    } while (local_b0 < local_78.m_num_imm + local_78.m_num_nodes);
  }
LAB_00205eab:
  if (local_a8 != (size_t *)0x0) {
    *local_a8 = *local_a8 + local_a0[0];
  }
  return;
}

Assistant:

void cali_find_all_in_snapshot(
    const unsigned char* buf,
    cali_id_t            attr_id,
    size_t*              bytes_read,
    cali_entry_proc_fn   proc_fn,
    void*                user_arg
)
{
    size_t                   pos = 0;
    ::UnpackAttributeEntryOp op(attr_id, proc_fn, user_arg);

    // FIXME: Need sigsafe instance? Only does read-only
    // node-by-id lookup though, so we should be safe
    Caliper c;

    CompressedSnapshotRecordView(buf, &pos).unpack(&c, op);

    if (bytes_read)
        *bytes_read += pos;
}